

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  int dictSize_local;
  char *dictStart_local;
  int maxOutputSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  
  if (dictSize == 0) {
    source_local._4_4_ = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else if (dictStart + dictSize == dest) {
    if (dictSize < 0xffff) {
      source_local._4_4_ =
           LZ4_decompress_safe_withSmallPrefix
                     (source,dest,compressedSize,maxOutputSize,(long)dictSize);
    }
    else {
      source_local._4_4_ =
           LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
    }
  }
  else {
    source_local._4_4_ =
         LZ4_decompress_safe_forceExtDict
                   (source,dest,compressedSize,maxOutputSize,dictStart,(long)dictSize);
  }
  return source_local._4_4_;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}